

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_remove(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue JVar1;
  char *__filename;
  ssize_t sVar2;
  undefined4 in_ECX;
  char *in_R8;
  int ret;
  char *filename;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int64_t in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val1.u._4_4_ = in_stack_ffffffffffffff9c;
  val1.u.int32 = in_stack_ffffffffffffff98;
  val1.tag = in_stack_ffffffffffffffa0;
  __filename = JS_ToCString((JSContext *)0x114c92,val1);
  if (__filename == (char *)0x0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    remove(__filename);
    sVar2 = js_get_errno(0x114cca);
    local_30 = (undefined4)sVar2;
    JS_FreeCString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_R8);
    uStack_2c = uStack_c;
    local_28 = 0;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_remove(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *filename;
    int ret;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
#if defined(_WIN32)
    {
        struct stat st;
        if (stat(filename, &st) == 0 && S_ISDIR(st.st_mode)) {
            ret = rmdir(filename);
        } else {
            ret = unlink(filename);
        }
    }
#else
    ret = remove(filename);
#endif
    ret = js_get_errno(ret);
    JS_FreeCString(ctx, filename);
    return JS_NewInt32(ctx, ret);
}